

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall
ImFontAtlas::AddCustomRectFontGlyph
          (ImFontAtlas *this,ImFont *font,ImWchar id,int width,int height,float advance_x,
          ImVec2 *offset)

{
  undefined1 local_50 [8];
  CustomRect r;
  ImVec2 *offset_local;
  float advance_x_local;
  int height_local;
  int width_local;
  ImWchar id_local;
  ImFont *font_local;
  ImFontAtlas *this_local;
  
  r.Font = (ImFont *)offset;
  if (font == (ImFont *)0x0) {
    __assert_fail("font != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_draw.cpp"
                  ,0x692,
                  "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
                 );
  }
  if (width < 1 || 0xffff < width) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_draw.cpp"
                  ,0x693,
                  "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
                 );
  }
  if (height < 1 || 0xffff < height) {
    __assert_fail("height > 0 && height <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_draw.cpp"
                  ,0x694,
                  "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
                 );
  }
  CustomRect::CustomRect((CustomRect *)local_50);
  local_50._0_4_ = ZEXT24(id);
  local_50._4_2_ = (undefined2)width;
  local_50._6_2_ = (undefined2)height;
  r._8_8_ = *(undefined8 *)&(r.Font)->IndexAdvanceX;
  r._4_4_ = advance_x;
  r.GlyphOffset = (ImVec2)font;
  ImVector<ImFontAtlas::CustomRect>::push_back(&this->CustomRects,(CustomRect *)local_50);
  return (this->CustomRects).Size + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectFontGlyph(ImFont* font, ImWchar id, int width, int height, float advance_x, const ImVec2& offset)
{
    IM_ASSERT(font != NULL);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    r.GlyphAdvanceX = advance_x;
    r.GlyphOffset = offset;
    r.Font = font;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}